

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnEndExpr(BinaryReaderInterp *this)

{
  pointer *ppLVar1;
  LabelType LVar2;
  uint uVar3;
  pointer pLVar4;
  pointer pHVar5;
  Result RVar6;
  Offset OVar7;
  Enum EVar8;
  Label *label;
  Location loc;
  Label *local_50;
  Location local_48;
  
  EVar8 = Ok;
  if ((long)(this->label_stack_).
            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->label_stack_).
            super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x10) {
    RVar6 = TypeChecker::GetLabel(&(this->validator_).typechecker_,0,&local_50);
    EVar8 = Error;
    if (RVar6.enum_ != Error) {
      LVar2 = local_50->label_type;
      local_48.field_1.field_0.last_column = 0;
      local_48.filename._M_len = (this->filename_)._M_len;
      local_48.filename._M_str = (this->filename_)._M_str;
      local_48.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      RVar6 = SharedValidator::OnEnd(&this->validator_,&local_48);
      if (RVar6.enum_ != Error) {
        if ((LVar2 & ~InitExpr) == If) {
          pLVar4 = (this->label_stack_).
                   super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pLVar4 == (this->label_stack_).
                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
LAB_001aba78:
            __assert_fail("depth < label_stack_.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                          ,0x180,
                          "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                         );
          }
          Istream::ResolveFixupU32(this->istream_,pLVar4[-1].fixup_offset);
        }
        else if (LVar2 == Catch) {
          Istream::EmitCatchDrop(this->istream_,1);
        }
        else if (LVar2 == Try) {
          pLVar4 = (this->label_stack_).
                   super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pLVar4 == (this->label_stack_).
                        super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                        ._M_impl.super__Vector_impl_data._M_start) goto LAB_001aba78;
          uVar3 = pLVar4[-1].handler_desc_index;
          pHVar5 = (this->func_->handlers).
                   super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          OVar7 = Istream::end(this->istream_);
          pHVar5[uVar3].try_end_offset = OVar7;
          if (*(pointer *)
               ((long)&pHVar5[uVar3].catches.
                       super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                       ._M_impl + 8) !=
              *(pointer *)
               &pHVar5[uVar3].catches.
                super__Vector_base<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>
                ._M_impl) {
            __assert_fail("desc.catches.size() == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                          ,0x41d,
                          "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnEndExpr()"
                         );
          }
        }
        FixupMap::Resolve(&this->depth_fixups_,this->istream_,
                          (int)((ulong)((long)(this->label_stack_).
                                              super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->label_stack_).
                                             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1);
        ppLVar1 = &(this->label_stack_).
                   super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + -1;
        EVar8 = Ok;
      }
    }
  }
  return (Result)EVar8;
}

Assistant:

Result BinaryReaderInterp::OnSimdStoreLaneExpr(Opcode opcode,
                                               Index memidx,
                                               Address alignment_log2,
                                               Address offset,
                                               uint64_t value) {
  CHECK_RESULT(validator_.OnSimdStoreLane(GetLocation(), opcode,
                                          Var(memidx, GetLocation()),
                                          GetAlignment(alignment_log2), value));
  istream_.Emit(opcode, memidx, offset, static_cast<u8>(value));
  return Result::Ok;
}